

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

void * tommy_tree_search_compare(tommy_tree *tree,undefined1 *cmp,void *cmp_arg)

{
  long lVar1;
  tommy_tree_node *ptVar2;
  long in_FS_OFFSET;
  tommy_tree_node *node;
  void *cmp_arg_local;
  undefined1 *cmp_local;
  tommy_tree *tree_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = tommy_tree_search_node(cmp,tree->root,cmp_arg);
  if (ptVar2 == (tommy_tree_node *)0x0) {
    tree_local = (tommy_tree *)0x0;
  }
  else {
    tree_local = (tommy_tree *)ptVar2->data;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return tree_local;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_tree_search_compare(tommy_tree* tree, tommy_compare_func* cmp, void* cmp_arg)
{
	tommy_tree_node* node = tommy_tree_search_node(cmp, tree->root, cmp_arg);

	if (!node)
		return 0;

	return node->data;
}